

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

bool __thiscall slang::ast::Type::isSimpleBitVector(Type *this)

{
  bool bVar1;
  Type *this_00;
  bool bVar2;
  
  this_00 = getCanonicalType(this);
  bVar1 = isPredefinedInteger(this_00);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = isScalar(this_00);
    if (!bVar1) {
      if ((this_00->super_Symbol).kind == PackedArrayType) {
        bVar1 = isScalar((Type *)this_00[1].super_Symbol.name._M_len);
        return bVar1;
      }
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool Type::isSimpleBitVector() const {
    const Type& ct = getCanonicalType();
    if (ct.isPredefinedInteger() || ct.isScalar())
        return true;

    return ct.kind == SymbolKind::PackedArrayType &&
           ct.as<PackedArrayType>().elementType.isScalar();
}